

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecodeJitCommon.c
# Opt level: O3

void sysbvm_bytecodeJit_jit(sysbvm_context_t *context,sysbvm_functionBytecode_t *functionBytecode)

{
  byte bVar1;
  sysbvm_functionBytecode_t *bytecode;
  sysbvm_context_t *context_00;
  byte bVar2;
  byte bVar3;
  _Bool _Var4;
  uint uVar5;
  uint8_t *value;
  ulong uVar6;
  ushort sourceOperand;
  uint uVar7;
  byte opcode;
  code *pcVar8;
  char *message;
  int applicationFlags;
  ulong uVar9;
  uint8_t i;
  ulong uVar10;
  sysbvm_tuple_t sVar11;
  size_t sVar12;
  long lVar13;
  ulong uVar14;
  int16_t decodedOperands [64];
  uint8_t *codeWriteablePointer;
  uint8_t *codeExecutablePointer;
  sysbvm_gdb_jit_code_entry_t *entry;
  sysbvm_bytecodeJit_t jit;
  undefined8 local_530;
  ushort local_528 [68];
  uint8_t *local_4a0;
  ulong local_498;
  uint8_t *local_490;
  sysbvm_context_t *local_488;
  ulong local_480;
  long local_478;
  sysbvm_gdb_jit_code_entry_t *local_470;
  sysbvm_bytecodeJit_t local_468;
  
  uVar14 = 0;
  sysbvm_bytecodeInterpreter_ensureTablesAreFilled();
  sysbvm_bytecodeJit_initialize(&local_468,context);
  local_468.sourcePosition = functionBytecode->sourcePosition;
  local_468.compiledProgramEntity = functionBytecode->definition;
  local_488 = context;
  local_468.literalVectorGCRoot = sysbvm_heap_allocateGCRootTableEntry(&context->heap);
  uVar9 = functionBytecode->literalVector;
  *local_468.literalVectorGCRoot = uVar9;
  uVar10 = functionBytecode->instructions;
  if ((uVar10 & 0xf) == 0 && uVar10 != 0) {
    uVar14 = (ulong)*(uint *)(uVar10 + 0xc);
  }
  local_528[0x38] = 0;
  local_528[0x39] = 0;
  local_528[0x3a] = 0;
  local_528[0x3b] = 0;
  local_528[0x3c] = 0;
  local_528[0x3d] = 0;
  local_528[0x3e] = 0;
  local_528[0x3f] = 0;
  local_528[0x30] = 0;
  local_528[0x31] = 0;
  local_528[0x32] = 0;
  local_528[0x33] = 0;
  local_528[0x34] = 0;
  local_528[0x35] = 0;
  local_528[0x36] = 0;
  local_528[0x37] = 0;
  local_528[0x28] = 0;
  local_528[0x29] = 0;
  local_528[0x2a] = 0;
  local_528[0x2b] = 0;
  local_528[0x2c] = 0;
  local_528[0x2d] = 0;
  local_528[0x2e] = 0;
  local_528[0x2f] = 0;
  local_528[0x20] = 0;
  local_528[0x21] = 0;
  local_528[0x22] = 0;
  local_528[0x23] = 0;
  local_528[0x24] = 0;
  local_528[0x25] = 0;
  local_528[0x26] = 0;
  local_528[0x27] = 0;
  local_528[0x18] = 0;
  local_528[0x19] = 0;
  local_528[0x1a] = 0;
  local_528[0x1b] = 0;
  local_528[0x1c] = 0;
  local_528[0x1d] = 0;
  local_528[0x1e] = 0;
  local_528[0x1f] = 0;
  local_528[0x10] = 0;
  local_528[0x11] = 0;
  local_528[0x12] = 0;
  local_528[0x13] = 0;
  local_528[0x14] = 0;
  local_528[0x15] = 0;
  local_528[0x16] = 0;
  local_528[0x17] = 0;
  local_528[8] = 0;
  local_528[9] = 0;
  local_528[10] = 0;
  local_528[0xb] = 0;
  local_528[0xc] = 0;
  local_528[0xd] = 0;
  local_528[0xe] = 0;
  local_528[0xf] = 0;
  local_528[0] = 0;
  local_528[1] = 0;
  local_528[2] = 0;
  local_528[3] = 0;
  local_528[4] = 0;
  local_528[5] = 0;
  local_528[6] = 0;
  local_528[7] = 0;
  local_468.argumentCount = functionBytecode->argumentCount;
  if (local_468.argumentCount == 0 || (local_468.argumentCount & 0xf) != 0) {
    local_468.argumentCount = (long)local_468.argumentCount >> 4;
  }
  else {
    local_468.argumentCount = *(ulong *)(local_468.argumentCount + 0x10);
  }
  local_468.captureVectorSize = functionBytecode->captureVectorSize;
  if (local_468.captureVectorSize == 0 || (local_468.captureVectorSize & 0xf) != 0) {
    local_468.captureVectorSize = (long)local_468.captureVectorSize >> 4;
  }
  else {
    local_468.captureVectorSize = *(ulong *)(local_468.captureVectorSize + 0x10);
  }
  if ((uVar9 & 0xf) == 0 && uVar9 != 0) {
    local_468.literalCount = (size_t)(*(uint *)(uVar9 + 0xc) >> 3);
  }
  else {
    local_468.literalCount = 0;
  }
  local_468.localVectorSize = functionBytecode->localVectorSize;
  if (local_468.localVectorSize == 0 || (local_468.localVectorSize & 0xf) != 0) {
    local_468.localVectorSize = (long)local_468.localVectorSize >> 4;
  }
  else {
    local_468.localVectorSize = *(ulong *)(local_468.localVectorSize + 0x10);
  }
  local_530 = functionBytecode;
  local_468.pcDestinations = (intptr_t *)malloc(uVar14 * 8);
  memset(local_468.pcDestinations,0xff,uVar14 * 8);
  sysbvm_jit_prologue(&local_468);
  if (uVar14 != 0) {
    local_478 = uVar10 + 0x11;
    uVar6 = 0;
    uVar9 = 0;
    local_480 = uVar14;
    do {
      local_468.pcDestinations[uVar9] = local_468.instructions.size;
      sysbvm_jit_storePC(&local_468,(uint16_t)uVar9);
      sysbvm_bytecodeJit_addSourcePositionRecord
                (&local_468,local_530,(uint16_t)uVar9,local_468.instructions.size);
      bVar1 = *(byte *)(uVar10 + 0x10 + uVar9);
      if (bVar1 == 0x1f) {
        sVar12 = uVar9 + 3;
        uVar6 = (ulong)*(byte *)(uVar10 + 0x12 + uVar9) << 8 | uVar6 << 0x10 |
                (ulong)*(byte *)(uVar10 + 0x11 + uVar9);
        goto LAB_00152703;
      }
      if (bVar1 < 0x40) {
        uVar6 = (ulong)(bVar1 >> 4);
        local_498 = 0;
        opcode = bVar1;
      }
      else {
        uVar6 = (ulong)(bVar1 & 0xf) | uVar6 << 4;
        opcode = bVar1 & 0xf0;
        local_498 = 0;
        if (opcode == 0xe0) {
          local_498 = uVar6;
        }
        uVar6 = (ulong)sysbvm_implicitVariableBytecodeOperandCountTable[bVar1 >> 4] +
                (uVar6 << (opcode == 0xe0));
        if (0x3f < uVar6) {
          sysbvm_error_assertionFailure
                    (
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/lib/sysbvm/bytecodeJitCommon.c:487: assertion failure: operandCount < SYSBVM_BYTECODE_FUNCTION_OPERAND_REGISTER_FILE_SIZE"
                    );
        }
      }
      sVar12 = uVar9 + 1;
      if (uVar14 < sVar12 + uVar6 * 2) {
        sysbvm_error_assertionFailure
                  (
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/lib/sysbvm/bytecodeJitCommon.c:488: assertion failure: pc + operandCount*2 <= instructionsSize"
                  );
      }
      if (uVar6 != 0) {
        lVar13 = uVar9 + local_478;
        uVar9 = 0;
        do {
          sVar12 = sVar12 + 2;
          local_528[uVar9] = *(ushort *)(lVar13 + uVar9 * 2);
          uVar9 = uVar9 + 1;
        } while ((uVar9 & 0xff) < uVar6);
      }
      bVar2 = sysbvm_bytecodeInterpreter_destinationOperandCountForOpcode(opcode);
      bVar3 = sysbvm_bytecodeInterpreter_offsetOperandCountForOpcode(opcode);
      if (bVar2 == 0) {
        uVar9 = 0;
      }
      else {
        uVar9 = (ulong)bVar2;
        uVar14 = 0;
        do {
          if ((~local_528[uVar14] & 3) != 0) {
            sysbvm_error("Bytecode destination operands must be in the local vector.");
          }
          uVar5 = (uint)(int)(short)local_528[uVar14] >> 2;
          if ((-1 < (short)uVar5) && (local_468.localVectorSize <= (uVar5 & 0xffff))) {
            sysbvm_error("Bytecode destination operand is beyond the local vector bounds.");
          }
          uVar14 = uVar14 + 1;
        } while (uVar9 != uVar14);
      }
      lVar13 = bVar3 + local_498;
      while (uVar14 = local_480, uVar9 < uVar6 - lVar13) {
        if (0x3f < bVar2) {
          sysbvm_error_assertionFailure
                    (
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/lib/sysbvm/bytecodeJitCommon.c:513: assertion failure: i < SYSBVM_BYTECODE_FUNCTION_OPERAND_REGISTER_FILE_SIZE"
                    );
        }
        switch(local_528[uVar9] & 3) {
        case 0:
          message = "Bytecode operand is beyond the argument vector bounds.";
          uVar14 = local_468.argumentCount;
          break;
        case 1:
          message = "Bytecode operand is beyond the capture vector bounds.";
          uVar14 = local_468.captureVectorSize;
          break;
        case 2:
          message = "Bytecode operand is beyond the literal vector bounds.";
          uVar14 = local_468.literalCount;
          break;
        case 3:
          message = "Bytecode operand is beyond the local vector bounds.";
          uVar14 = local_468.localVectorSize;
        }
        if (uVar14 <= (ulong)(long)(short)((uint)(int)(short)local_528[uVar9] >> 2)) {
          sysbvm_error(message);
        }
        bVar2 = bVar2 + 1;
        uVar9 = (ulong)bVar2;
      }
      if (0x3f < opcode) {
        uVar5 = (uint)bVar1;
        if (opcode < 0x80) {
          if (opcode < 0x60) {
            if (opcode == 0x40) {
              applicationFlags = 0;
            }
            else {
              if (opcode != 0x50) {
switchD_001522c4_caseD_3:
                sysbvm_error("Unsupported bytecode instruction.");
              }
              applicationFlags = 1;
            }
            sysbvm_jit_functionApply
                      (&local_468,local_528[0],local_528[1],(ulong)(uVar5 & 0xf),
                       (int16_t *)(local_528 + 2),applicationFlags);
          }
          else if (opcode == 0x60) {
            sysbvm_jit_send(&local_468,local_528[0],local_528[1],(ulong)(uVar5 & 0xf),
                            (int16_t *)(local_528 + 2),0);
          }
          else {
            if (opcode != 0x70) goto switchD_001522c4_caseD_3;
            sysbvm_jit_sendWithReceiverType
                      (&local_468,local_528[0],local_528[1],local_528[2],(ulong)(uVar5 & 0xf),
                       (int16_t *)(local_528 + 3),0);
          }
        }
        else {
          uVar7 = (uint)bVar1;
          if (opcode < 0xa0) {
            if (opcode == 0x80) {
              sysbvm_jit_makeArray
                        (&local_468,local_528[0],(ulong)(uVar7 & 0xf),(int16_t *)(local_528 + 1));
            }
            else {
              if (opcode != 0x90) goto switchD_001522c4_caseD_3;
              sysbvm_jit_makeByteArray
                        (&local_468,local_528[0],(ulong)(uVar5 & 0xf),(int16_t *)(local_528 + 1));
            }
          }
          else if (opcode == 0xa0) {
            sysbvm_jit_makeClosureWithCaptures
                      (&local_468,local_528[0],local_528[1],(ulong)(uVar7 & 0xf),
                       (int16_t *)(local_528 + 2));
          }
          else if (opcode == 0xb0) {
            sysbvm_jit_makeDictionary
                      (&local_468,local_528[0],(ulong)(uVar7 & 0xf),(int16_t *)(local_528 + 1));
          }
          else {
            if (opcode != 0xe0) goto switchD_001522c4_caseD_3;
            sysbvm_jit_caseJump(&local_468,local_528[0],local_498,(int16_t *)(local_528 + 1),
                                (int16_t *)(local_528 + 1 + local_498),
                                *(int16_t *)((long)&local_530 + uVar6 * 2 + 6),sVar12);
          }
        }
        goto switchD_001522c4_caseD_0;
      }
      switch(opcode) {
      case 0:
      case 0x27:
        break;
      case 1:
        sysbvm_jit_breakpoint(&local_468);
        break;
      case 2:
        sysbvm_jit_unreachable(&local_468);
        break;
      default:
        goto switchD_001522c4_caseD_3;
      case 0x10:
        sysbvm_jit_return(&local_468,local_528[0]);
        break;
      case 0x11:
        if ((short)local_528[0] < 0) {
          sysbvm_jit_callWithContextNoResult0(&local_468,sysbvm_gc_safepoint);
        }
        sysbvm_jit_jumpRelative(&local_468,(long)(short)local_528[0] + sVar12);
        break;
      case 0x20:
        pcVar8 = sysbvm_pointerLikeType_withEmptyBox;
        goto LAB_001525c7;
      case 0x21:
        sourceOperand = local_528[1];
        goto LAB_0015259c;
      case 0x22:
        pcVar8 = sysbvm_pointerLikeType_load;
        goto LAB_001525c7;
      case 0x23:
        pcVar8 = sysbvm_bytecodeJit_symbolValueBinding_getValue;
LAB_001525c7:
        sysbvm_jit_callWithContext1(&local_468,pcVar8,local_528[0],local_528[1]);
        break;
      case 0x24:
        sysbvm_jit_callWithContextNoResult2
                  (&local_468,sysbvm_pointerLikeType_store,local_528[0],local_528[1]);
        break;
      case 0x25:
        if ((short)local_528[1] < 0) {
          sysbvm_jit_callWithContextNoResult0(&local_468,sysbvm_gc_safepoint);
        }
        sysbvm_jit_jumpRelativeIfTrue(&local_468,local_528[0],(long)(short)local_528[1] + sVar12);
        break;
      case 0x26:
        if ((short)local_528[1] < 0) {
          sysbvm_jit_callWithContextNoResult0(&local_468,sysbvm_gc_safepoint);
        }
        sysbvm_jit_jumpRelativeIfFalse(&local_468,local_528[0],(long)(short)local_528[1] + sVar12);
        break;
      case 0x30:
        pcVar8 = sysbvm_pointerLikeType_withBoxForValue;
        goto LAB_001526f6;
      case 0x31:
        pcVar8 = sysbvm_type_coerceValue;
        goto LAB_001526f6;
      case 0x32:
        pcVar8 = sysbvm_type_downCastValue;
        goto LAB_001526f6;
      case 0x33:
        sourceOperand = local_528[2];
LAB_0015259c:
        sysbvm_jit_moveOperandToOperand(&local_468,local_528[0],sourceOperand);
        break;
      case 0x34:
        pcVar8 = sysbvm_association_create;
        goto LAB_001526f6;
      case 0x36:
        pcVar8 = sysbvm_bytecodeJit_slotAt;
        goto LAB_001526f6;
      case 0x37:
        pcVar8 = sysbvm_bytecodeJit_slotReferenceAt;
        goto LAB_001526f6;
      case 0x38:
        pcVar8 = sysbvm_bytecodeJit_slotAtPut;
        goto LAB_00152535;
      case 0x39:
        pcVar8 = sysbvm_bytecodeJit_refSlotAt;
        goto LAB_001526f6;
      case 0x3a:
        pcVar8 = sysbvm_bytecodeJit_refSlotReferenceAt;
LAB_001526f6:
        sysbvm_jit_callWithContext2(&local_468,pcVar8,local_528[0],local_528[1],local_528[2]);
        break;
      case 0x3b:
        pcVar8 = sysbvm_bytecodeJit_refSlotAtPut;
LAB_00152535:
        sysbvm_jit_callWithContextNoResult3
                  (&local_468,pcVar8,local_528[0],local_528[1],local_528[2]);
      }
switchD_001522c4_caseD_0:
      uVar6 = 0;
LAB_00152703:
      uVar9 = sVar12;
    } while (sVar12 < uVar14);
  }
  sysbvm_jit_finish(&local_468);
  uVar10 = local_468.objectFileHeader.size + 0xf & 0xfffffffffffffff0;
  uVar14 = local_468.instructions.size + 0xf & 0xfffffffffffffff0;
  uVar9 = local_468.constants.size + 0xf & 0xfffffffffffffff0;
  sVar12 = (local_468.unwindInfo.size + 0xf & 0xfffffffffffffff0) + uVar9 + uVar14 + uVar10 +
           (local_468.dwarfDebugInfoBuilder.str.size + 0xf & 0xfffffffffffffff0) +
           (local_468.dwarfDebugInfoBuilder.line.size + 0xf & 0xfffffffffffffff0) +
           (local_468.dwarfEhBuilder.buffer.size + 0xf & 0xfffffffffffffff0) +
           (local_468.objectFileContent.size + 0xf & 0xfffffffffffffff0) +
           (local_468.dwarfDebugInfoBuilder.info.size + 0xf & 0xfffffffffffffff0) +
           (local_468.dwarfDebugInfoBuilder.abbrev.size + 0xf & 0xfffffffffffffff0);
  local_4a0 = (uint8_t *)0x0;
  local_490 = (uint8_t *)0x0;
  sysbvm_chunkedAllocator_allocateWithDualMapping
            (&(local_488->heap).codeAllocator,sVar12,0x10,&local_4a0,&local_490);
  _Var4 = sysbvm_virtualMemory_lockCodePagesForWriting(local_4a0,local_490,sVar12);
  if (_Var4) {
    memset(local_4a0 + uVar10,0xcc,uVar14);
    memset(local_4a0 + uVar14 + uVar10,0,uVar9);
    value = sysbvm_jit_installIn(&local_468,local_4a0,local_490);
    sysbvm_virtualMemory_unlockCodePagesForExecution(local_4a0,local_490,sVar12);
    context_00 = local_488;
    if ((local_468.objectFileHeader.size != 0) && (local_468.objectFileContent.size != 0)) {
      local_470 = (sysbvm_gdb_jit_code_entry_t *)calloc(1,0x20);
      sysbvm_dynarray_add(&context_00->jittedObjectFileEntries,&local_470);
      sysbvm_gdb_registerObjectFile(local_470,local_490,sVar12);
    }
    bytecode = local_530;
    if ((ulong)(value + 0x800000000000000) >> 0x3c == 0) {
      sVar11 = (long)value << 4 | 0xc;
    }
    else {
      sVar11 = sysbvm_tuple_int64_encodeBig(context_00,(int64_t)value);
    }
    bytecode->jittedCode = sVar11;
    bytecode->jittedCodeSessionToken = (context_00->roots).sessionToken;
    sysbvm_jit_patchTrampolineWithRealEntryPoint(&local_468,bytecode);
    sysbvm_bytecodeJit_jitFree(&local_468);
    return;
  }
  abort();
}

Assistant:

SYSBVM_API void sysbvm_bytecodeJit_jit(sysbvm_context_t *context, sysbvm_functionBytecode_t *functionBytecode)
{
    (void)context;
    sysbvm_bytecodeInterpreter_ensureTablesAreFilled();

    sysbvm_bytecodeJit_t jit;
    sysbvm_bytecodeJit_initialize(&jit, context);

    jit.sourcePosition = functionBytecode->sourcePosition;
    jit.compiledProgramEntity = functionBytecode->definition;

    jit.literalVectorGCRoot = sysbvm_heap_allocateGCRootTableEntry(&context->heap);
    *jit.literalVectorGCRoot = functionBytecode->literalVector;

    size_t instructionsSize = sysbvm_tuple_getSizeInBytes(functionBytecode->instructions);
    uint8_t *instructions = SYSBVM_CAST_OOP_TO_OBJECT_TUPLE(functionBytecode->instructions)->bytes;

    int16_t decodedOperands[SYSBVM_BYTECODE_FUNCTION_OPERAND_REGISTER_FILE_SIZE] = {0};
    jit.argumentCount = sysbvm_tuple_size_decode(functionBytecode->argumentCount);
    jit.captureVectorSize = sysbvm_tuple_size_decode(functionBytecode->captureVectorSize);
    jit.literalCount = sysbvm_tuple_getSizeInSlots(functionBytecode->literalVector);
    jit.localVectorSize = sysbvm_tuple_size_decode(functionBytecode->localVectorSize);

    jit.pcDestinations = (intptr_t*)malloc(sizeof(intptr_t)*instructionsSize);
    memset(jit.pcDestinations, -1, sizeof(intptr_t)*instructionsSize);

    sysbvm_jit_prologue(&jit);

    size_t pc = 0;
    size_t countExtension = 0;
    while(pc < instructionsSize)
    {
        jit.pcDestinations[pc] = jit.instructions.size;
        sysbvm_jit_storePC(&jit, (uint16_t)pc);

        sysbvm_bytecodeJit_addSourcePositionRecord(&jit, functionBytecode, (uint16_t)pc, jit.instructions.size);

        uint8_t opcode = instructions[pc++];
        if(opcode == SYSBVM_OPCODE_COUNT_EXTENSION)
        {
            uint8_t lowByte = instructions[pc++];
            uint8_t highByte = instructions[pc++];
            countExtension = (countExtension << 16) | (highByte << 8) | lowByte;
            continue;
        }

        uint8_t standardOpcode = opcode;
        size_t operandCount = 0;
        size_t caseCount = 0;
        if(opcode >= SYSBVM_OPCODE_FIRST_VARIABLE)
        {
            operandCount = (countExtension << 4) + (opcode & 0x0F);
            standardOpcode = opcode & 0xF0;
            if(standardOpcode == SYSBVM_OPCODE_CASE_JUMP)
            {
                caseCount = operandCount;
                operandCount *= 2;
            }

            operandCount += sysbvm_implicitVariableBytecodeOperandCountTable[opcode >> 4];
        }
        else
        {
            operandCount = opcode >> 4;
        }
        countExtension = 0;

        // Decode the operands.
        SYSBVM_ASSERT(operandCount < SYSBVM_BYTECODE_FUNCTION_OPERAND_REGISTER_FILE_SIZE);
        SYSBVM_ASSERT(pc + operandCount*2 <= instructionsSize);
        for(uint8_t i = 0; i < operandCount; ++i)
        {
            uint16_t lowByte = instructions[pc++];
            uint16_t highByte = instructions[pc++];
            decodedOperands[i] = lowByte | (highByte << 8);
        }

        // Validate the destination operands.
        uint8_t destinationOperandCount = sysbvm_bytecodeInterpreter_destinationOperandCountForOpcode(standardOpcode);
        size_t offsetOperandCount = caseCount + sysbvm_bytecodeInterpreter_offsetOperandCountForOpcode(standardOpcode);

        for(uint8_t i = 0; i < destinationOperandCount; ++i)
        {
            if((decodedOperands[i] & SYSBVM_OPERAND_VECTOR_BITMASK) != SYSBVM_OPERAND_VECTOR_LOCAL)
                sysbvm_error("Bytecode destination operands must be in the local vector.");
            
            int16_t vectorIndex = decodedOperands[i] >> SYSBVM_OPERAND_VECTOR_BITS;
            if(vectorIndex >= 0 && (size_t)vectorIndex >= jit.localVectorSize)
                sysbvm_error("Bytecode destination operand is beyond the local vector bounds.");
        }

        // Fetch the source operands.
        for(uint8_t i = destinationOperandCount; i < operandCount - offsetOperandCount; ++i)
        {
            SYSBVM_ASSERT(i < SYSBVM_BYTECODE_FUNCTION_OPERAND_REGISTER_FILE_SIZE);

            int16_t decodedOperand = decodedOperands[i];
            int16_t vectorIndex = decodedOperand >> SYSBVM_OPERAND_VECTOR_BITS;
            uint8_t vectorType = decodedOperand & SYSBVM_OPERAND_VECTOR_BITMASK;
            switch(vectorType)
            {
            case SYSBVM_OPERAND_VECTOR_ARGUMENTS:
                if((size_t)vectorIndex >= jit.argumentCount)
                    sysbvm_error("Bytecode operand is beyond the argument vector bounds.");
                break;
            case SYSBVM_OPERAND_VECTOR_CAPTURES:
                if((size_t)vectorIndex >= jit.captureVectorSize)
                    sysbvm_error("Bytecode operand is beyond the capture vector bounds.");
                break;
            case SYSBVM_OPERAND_VECTOR_LITERAL:
                if((size_t)vectorIndex >= jit.literalCount)
                    sysbvm_error("Bytecode operand is beyond the literal vector bounds.");
                break;
            case SYSBVM_OPERAND_VECTOR_LOCAL:
                if((size_t)vectorIndex >= jit.localVectorSize)
                    sysbvm_error("Bytecode operand is beyond the local vector bounds.");
                break;
            default:
                abort();
            }
        }

        // Execute the opcodes.
        switch(standardOpcode)
        {
        // Zero operands
        case SYSBVM_OPCODE_NOP:
            // Nothing is required here.
            break;
        case SYSBVM_OPCODE_BREAKPOINT:
            // Nothing is required here.
            sysbvm_jit_breakpoint(&jit);
            break;
        case SYSBVM_OPCODE_UNREACHABLE:
            // Nothing is required here.
            sysbvm_jit_unreachable(&jit);
            break;
        
        // One operands
        case SYSBVM_OPCODE_RETURN:
            sysbvm_jit_return(&jit, decodedOperands[0]);
            break;
        case SYSBVM_OPCODE_JUMP:
            if(decodedOperands[0] < 0)
                sysbvm_jit_callWithContextNoResult0(&jit, &sysbvm_gc_safepoint);
            sysbvm_jit_jumpRelative(&jit, pc + decodedOperands[0]);
            break;
        // Two operands.
        case SYSBVM_OPCODE_ALLOCA:
            sysbvm_jit_callWithContext1(&jit, &sysbvm_pointerLikeType_withEmptyBox, decodedOperands[0], decodedOperands[1]);
            break;
        case SYSBVM_OPCODE_LOAD:
            sysbvm_jit_callWithContext1(&jit, &sysbvm_pointerLikeType_load, decodedOperands[0], decodedOperands[1]);
            break;
        case SYSBVM_OPCODE_LOAD_SYMBOL_VALUE_BINDING:
            sysbvm_jit_callWithContext1(&jit, &sysbvm_bytecodeJit_symbolValueBinding_getValue, decodedOperands[0], decodedOperands[1]);
            break;
        case SYSBVM_OPCODE_STORE:
            sysbvm_jit_callWithContextNoResult2(&jit, &sysbvm_pointerLikeType_store, decodedOperands[0], decodedOperands[1]);
            break;
        case SYSBVM_OPCODE_MOVE:
            sysbvm_jit_moveOperandToOperand(&jit, decodedOperands[0], decodedOperands[1]);
            break;
        case SYSBVM_OPCODE_JUMP_IF_TRUE:
            if(decodedOperands[1] < 0)
                sysbvm_jit_callWithContextNoResult0(&jit, &sysbvm_gc_safepoint);
            sysbvm_jit_jumpRelativeIfTrue(&jit, decodedOperands[0], pc + decodedOperands[1]);
            break;
        case SYSBVM_OPCODE_JUMP_IF_FALSE:
            if(decodedOperands[1] < 0)
                sysbvm_jit_callWithContextNoResult0(&jit, &sysbvm_gc_safepoint);
            sysbvm_jit_jumpRelativeIfFalse(&jit, decodedOperands[0], pc + decodedOperands[1]);
            break;
        case SYSBVM_OPCODE_SET_DEBUG_VALUE:
            // NOP
            break;

        // Three operands.
        case SYSBVM_OPCODE_ALLOCA_WITH_VALUE:
            sysbvm_jit_callWithContext2(&jit, &sysbvm_pointerLikeType_withBoxForValue, decodedOperands[0], decodedOperands[1], decodedOperands[2]);
            break;
        case SYSBVM_OPCODE_COERCE_VALUE:
            sysbvm_jit_callWithContext2(&jit, &sysbvm_type_coerceValue, decodedOperands[0], decodedOperands[1], decodedOperands[2]);
            break;
        case SYSBVM_OPCODE_DOWNCAST_VALUE:
            sysbvm_jit_callWithContext2(&jit, &sysbvm_type_downCastValue, decodedOperands[0], decodedOperands[1], decodedOperands[2]);
            break;
        case SYSBVM_OPCODE_UNCHECKED_DOWNCAST_VALUE:
            sysbvm_jit_moveOperandToOperand(&jit, decodedOperands[0], decodedOperands[2]);
            break;
        case SYSBVM_OPCODE_MAKE_ASSOCIATION:
            sysbvm_jit_callWithContext2(&jit, &sysbvm_association_create, decodedOperands[0], decodedOperands[1], decodedOperands[2]);
            break;
        case SYSBVM_OPCODE_SLOT_AT:
            sysbvm_jit_callWithContext2(&jit, &sysbvm_bytecodeJit_slotAt, decodedOperands[0], decodedOperands[1], decodedOperands[2]);
            break;
        case SYSBVM_OPCODE_SLOT_AT_PUT:
            sysbvm_jit_callWithContextNoResult3(&jit, &sysbvm_bytecodeJit_slotAtPut, decodedOperands[0], decodedOperands[1], decodedOperands[2]);
            break;
        case SYSBVM_OPCODE_SLOT_REFERENCE_AT:
            sysbvm_jit_callWithContext2(&jit, &sysbvm_bytecodeJit_slotReferenceAt, decodedOperands[0], decodedOperands[1], decodedOperands[2]);
            break;
        case SYSBVM_OPCODE_REF_SLOT_AT:
            sysbvm_jit_callWithContext2(&jit, &sysbvm_bytecodeJit_refSlotAt, decodedOperands[0], decodedOperands[1], decodedOperands[2]);
            break;
        case SYSBVM_OPCODE_REF_SLOT_AT_PUT:
            sysbvm_jit_callWithContextNoResult3(&jit, &sysbvm_bytecodeJit_refSlotAtPut, decodedOperands[0], decodedOperands[1], decodedOperands[2]);
            break;
        case SYSBVM_OPCODE_REF_SLOT_REFERENCE_AT:
            sysbvm_jit_callWithContext2(&jit, &sysbvm_bytecodeJit_refSlotReferenceAt, decodedOperands[0], decodedOperands[1], decodedOperands[2]);
            break;

        // Variable operand.
        case SYSBVM_OPCODE_CALL:
            sysbvm_jit_functionApply(&jit, decodedOperands[0], decodedOperands[1], opcode & 0xF, decodedOperands + 2, 0);
            break;
        case SYSBVM_OPCODE_UNCHECKED_CALL:
            sysbvm_jit_functionApply(&jit, decodedOperands[0], decodedOperands[1], opcode & 0xF, decodedOperands + 2, SYSBVM_FUNCTION_APPLICATION_FLAGS_NO_TYPECHECK);
            break;
        case SYSBVM_OPCODE_SEND:
            sysbvm_jit_send(&jit, decodedOperands[0], decodedOperands[1], opcode & 0xF, decodedOperands + 2, 0);
            break;
        case SYSBVM_OPCODE_SEND_WITH_LOOKUP:
            sysbvm_jit_sendWithReceiverType(&jit, decodedOperands[0], decodedOperands[1], decodedOperands[2], opcode & 0xF, decodedOperands + 3, 0);
            break;
        case SYSBVM_OPCODE_MAKE_ARRAY_WITH_ELEMENTS:
            sysbvm_jit_makeArray(&jit, decodedOperands[0], opcode & 0xF, decodedOperands + 1);
            break;
        case SYSBVM_OPCODE_MAKE_BYTE_ARRAY_WITH_ELEMENTS:
            sysbvm_jit_makeByteArray(&jit, decodedOperands[0], opcode & 0xF, decodedOperands + 1);
            break;
        case SYSBVM_OPCODE_MAKE_CLOSURE_WITH_CAPTURES:
            sysbvm_jit_makeClosureWithCaptures(&jit, decodedOperands[0], decodedOperands[1], opcode & 0xF, decodedOperands + 2);
            break;
        case SYSBVM_OPCODE_MAKE_DICTIONARY_WITH_ELEMENTS:
            sysbvm_jit_makeDictionary(&jit, decodedOperands[0], opcode & 0xF, decodedOperands + 1);
            break;

        case SYSBVM_OPCODE_CASE_JUMP:
            sysbvm_jit_caseJump(&jit, decodedOperands[0], caseCount, decodedOperands + 1, decodedOperands + 1 + caseCount, decodedOperands[operandCount - 1], pc);
            break;
        default:
            sysbvm_error("Unsupported bytecode instruction.");
            break;
        }
    }

    sysbvm_jit_finish(&jit);

    size_t objectFileHeaderSize = sysbvm_sizeAlignedTo(jit.objectFileHeader.size, 16);
    size_t textSectionSize = sysbvm_sizeAlignedTo(jit.instructions.size, 16);
    size_t rodataSectionSize = sysbvm_sizeAlignedTo(jit.constants.size, 16);
    size_t unwindInfoSize = sysbvm_sizeAlignedTo(jit.unwindInfo.size, 16)  + sysbvm_sizeAlignedTo(jit.dwarfEhBuilder.buffer.size, 16);
    size_t debugInfoSize = sysbvm_sizeAlignedTo(jit.dwarfDebugInfoBuilder.line.size, 16)
        + sysbvm_sizeAlignedTo(jit.dwarfDebugInfoBuilder.str.size, 16)
        + sysbvm_sizeAlignedTo(jit.dwarfDebugInfoBuilder.abbrev.size, 16)
        + sysbvm_sizeAlignedTo(jit.dwarfDebugInfoBuilder.info.size, 16);
    size_t objectFileContentSize = sysbvm_sizeAlignedTo(jit.objectFileContent.size, 16);

    size_t requiredCodeSize = objectFileHeaderSize + textSectionSize + rodataSectionSize + unwindInfoSize + debugInfoSize + objectFileContentSize;
    uint8_t *codeWriteablePointer = NULL;
    uint8_t *codeExecutablePointer = NULL;
    sysbvm_chunkedAllocator_allocateWithDualMapping(&context->heap.codeAllocator, requiredCodeSize, 16, (void**)&codeWriteablePointer, (void**)&codeExecutablePointer);
    if(!sysbvm_virtualMemory_lockCodePagesForWriting(codeWriteablePointer, codeExecutablePointer, requiredCodeSize))
        abort();

    memset(codeWriteablePointer + objectFileHeaderSize, 0xcc, textSectionSize); // int3;
    memset(codeWriteablePointer + objectFileHeaderSize + textSectionSize, 0, rodataSectionSize); // int3;
    uint8_t *entryPointPointer = sysbvm_jit_installIn(&jit, codeWriteablePointer, codeExecutablePointer);
    sysbvm_virtualMemory_unlockCodePagesForExecution(codeWriteablePointer, codeExecutablePointer, requiredCodeSize);

    // Register the object file with gdb.
    if(jit.objectFileHeader.size > 0 && jit.objectFileContent.size > 0)
    {
        sysbvm_gdb_jit_code_entry_t *entry = (sysbvm_gdb_jit_code_entry_t*)calloc(1, sizeof(sysbvm_gdb_jit_code_entry_t));
        sysbvm_dynarray_add(&context->jittedObjectFileEntries, &entry);
        sysbvm_gdb_registerObjectFile(entry, codeExecutablePointer, requiredCodeSize);
    }

    functionBytecode->jittedCode = sysbvm_tuple_systemHandle_encode(context, (sysbvm_systemHandle_t)(uintptr_t)entryPointPointer);
    functionBytecode->jittedCodeSessionToken = context->roots.sessionToken;

    // Patch the trampoline.
    sysbvm_jit_patchTrampolineWithRealEntryPoint(&jit, functionBytecode);

    sysbvm_bytecodeJit_jitFree(&jit);
}